

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarBmcInter_int(Aig_Man_t *pMan,Inter_ManParams_t *pPars,Aig_Man_t **ppNtkRes)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  Inter_ManParams_t *pIVar4;
  int iVar5;
  int nPis;
  uint uVar6;
  abctime aVar7;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Abc_Cex_t *pAVar10;
  Aig_Man_t *pAVar11;
  Aig_Man_t *pAVar12;
  abctime aVar13;
  uint local_a4;
  Abc_Cex_t *pCex;
  int Counter;
  int i;
  Aig_Obj_t *pObjPo;
  Aig_Man_t *pAux;
  Aig_Man_t *pTemp;
  int nTotalProvedSat;
  abctime clk;
  int iFrame;
  int RetValue;
  Aig_Man_t **ppNtkRes_local;
  Inter_ManParams_t *pPars_local;
  Aig_Man_t *pMan_local;
  
  clk._4_4_ = -1;
  _iFrame = ppNtkRes;
  ppNtkRes_local = (Aig_Man_t **)pPars;
  pPars_local = (Inter_ManParams_t *)pMan;
  aVar7 = Abc_Clock();
  pTemp._4_4_ = 0;
  if (pPars_local[1].fUsePudlak < 1) {
    __assert_fail("pMan->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x996,
                  "int Abc_NtkDarBmcInter_int(Aig_Man_t *, Inter_ManParams_t *, Aig_Man_t **)");
  }
  if (_iFrame != (Aig_Man_t **)0x0) {
    *_iFrame = (Aig_Man_t *)0x0;
  }
  if (*(int *)(ppNtkRes_local + 6) == 0) {
    clk._4_4_ = Inter_ManPerformInterpolation
                          ((Aig_Man_t *)pPars_local,(Inter_ManParams_t *)ppNtkRes_local,(int *)&clk)
    ;
  }
  else {
    pCex._0_4_ = 0;
    for (pCex._4_4_ = 0; iVar5 = Saig_ManPoNum((Aig_Man_t *)pPars_local), (int)pCex._4_4_ < iVar5;
        pCex._4_4_ = pCex._4_4_ + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)&pPars_local->fUsePudlak,pCex._4_4_);
      pAVar8 = Aig_ObjFanin0(pObj);
      pAVar9 = Aig_ManConst1((Aig_Man_t *)pPars_local);
      if (pAVar8 != pAVar9) {
        if (*(int *)(ppNtkRes_local + 8) != 0) {
          Saig_ManPoNum((Aig_Man_t *)pPars_local);
          Abc_Print(1,"Solving output %2d (out of %2d):\n",(ulong)pCex._4_4_);
        }
        pAVar11 = Aig_ManDupOneOutput((Aig_Man_t *)pPars_local,pCex._4_4_,1);
        pAVar12 = Aig_ManScl(pAVar11,1,1,0,-1,-1,0,0);
        Aig_ManStop(pAVar11);
        iVar5 = Aig_ManRegNum(pAVar12);
        if (iVar5 == 0) {
          pAVar12->pSeqModel = (Abc_Cex_t *)0x0;
          clk._4_4_ = Fra_FraigSat(pAVar12,(long)*(int *)ppNtkRes_local,0,0,0,0,0,0,0,0);
          if (pAVar12->pData != (void *)0x0) {
            iVar5 = Aig_ManRegNum((Aig_Man_t *)pPars_local);
            nPis = Saig_ManPiNum((Aig_Man_t *)pPars_local);
            pAVar10 = Abc_CexCreate(iVar5,nPis,(int *)pAVar12->pData,0,pCex._4_4_,1);
            pAVar12->pSeqModel = pAVar10;
          }
        }
        else {
          clk._4_4_ = Inter_ManPerformInterpolation
                                (pAVar12,(Inter_ManParams_t *)ppNtkRes_local,(int *)&clk);
        }
        pIVar4 = pPars_local;
        if (pAVar12->pSeqModel == (Abc_Cex_t *)0x0) {
          if (clk._4_4_ == 1) {
            pAVar8 = Aig_ManConst0((Aig_Man_t *)pPars_local);
            Aig_ObjPatchFanin0((Aig_Man_t *)pIVar4,pObj,pAVar8);
          }
          else {
            pCex._0_4_ = (uint)pCex + 1;
          }
          Aig_ManStop(pAVar12);
          uVar6 = Saig_ManPoNum((Aig_Man_t *)pPars_local);
          Abc_Print(1,"Solving output %3d (out of %3d) using interpolation.\r",(ulong)pCex._4_4_,
                    (ulong)uVar6);
        }
        else {
          if (*(int *)(ppNtkRes_local + 7) == 0) {
            pAVar10 = pAVar12->pSeqModel;
            *(Abc_Cex_t **)&pPars_local[5].nSecLimit = pAVar10;
            pAVar12->pSeqModel = (Abc_Cex_t *)0x0;
            pAVar10->iPo = pCex._4_4_;
            Aig_ManStop(pAVar12);
            break;
          }
          Abc_Print(1,"Output %d proved SAT in frame %d (replacing by const 0 and continuing...)\n",
                    (ulong)pCex._4_4_,(ulong)(uint)pAVar12->pSeqModel->iFrame);
          pIVar4 = pPars_local;
          pAVar8 = Aig_ManConst0((Aig_Man_t *)pPars_local);
          Aig_ObjPatchFanin0((Aig_Man_t *)pIVar4,pObj,pAVar8);
          Aig_ManStop(pAVar12);
          pTemp._4_4_ = pTemp._4_4_ + 1;
        }
      }
    }
    Aig_ManCleanup((Aig_Man_t *)pPars_local);
    lVar1._0_4_ = pPars_local[5].nSecLimit;
    lVar1._4_4_ = pPars_local[5].nFramesK;
    if (lVar1 == 0) {
      Saig_ManPoNum((Aig_Man_t *)pPars_local);
      Abc_Print(1,"Interpolation left %d (out of %d) outputs unsolved              \n",
                (ulong)(uint)pCex);
      if ((uint)pCex != 0) {
        clk._4_4_ = -1;
      }
    }
    if (_iFrame != (Aig_Man_t **)0x0) {
      pAVar11 = Aig_ManDupUnsolvedOutputs((Aig_Man_t *)pPars_local,1);
      pAVar12 = Aig_ManScl(pAVar11,1,1,0,-1,-1,0,0);
      *_iFrame = pAVar12;
      Aig_ManStop(pAVar11);
    }
  }
  if (pTemp._4_4_ != 0) {
    Abc_Print(1,"The total of %d outputs proved SAT and replaced by const 0 in this run.\n",
              (ulong)pTemp._4_4_);
  }
  if (clk._4_4_ == 1) {
    Abc_Print(1,"Property proved.  ");
  }
  else if (clk._4_4_ == 0) {
    lVar2._0_4_ = pPars_local[5].nSecLimit;
    lVar2._4_4_ = pPars_local[5].nFramesK;
    if (lVar2 == 0) {
      local_a4 = 0xffffffff;
    }
    else {
      local_a4 = **(uint **)&pPars_local[5].nSecLimit;
    }
    uVar3._0_4_ = pPars_local->nBTLimit;
    uVar3._4_4_ = pPars_local->nFramesMax;
    Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",(ulong)local_a4,uVar3,
              (ulong)(uint)clk);
  }
  else {
    if (clk._4_4_ != -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0x9ee,
                    "int Abc_NtkDarBmcInter_int(Aig_Man_t *, Inter_ManParams_t *, Aig_Man_t **)");
    }
    Abc_Print(1,"Property UNDECIDED.  ");
  }
  Abc_Print(1,"%s =","Time");
  aVar13 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar13 - aVar7) * 1.0) / 1000000.0);
  return clk._4_4_;
}

Assistant:

int Abc_NtkDarBmcInter_int( Aig_Man_t * pMan, Inter_ManParams_t * pPars, Aig_Man_t ** ppNtkRes )
{
    int RetValue = -1, iFrame;
    abctime clk = Abc_Clock();
    int nTotalProvedSat = 0;
    assert( pMan->nRegs > 0 );
    if ( ppNtkRes )
        *ppNtkRes = NULL;
    if ( pPars->fUseSeparate )
    {
        Aig_Man_t * pTemp, * pAux;
        Aig_Obj_t * pObjPo;
        int i, Counter = 0;
        Saig_ManForEachPo( pMan, pObjPo, i )
        {
            if ( Aig_ObjFanin0(pObjPo) == Aig_ManConst1(pMan) )
                continue;
            if ( pPars->fVerbose )
                Abc_Print( 1, "Solving output %2d (out of %2d):\n", i, Saig_ManPoNum(pMan) );
            pTemp = Aig_ManDupOneOutput( pMan, i, 1 );
            pTemp = Aig_ManScl( pAux = pTemp, 1, 1, 0, -1, -1, 0, 0 );
            Aig_ManStop( pAux );
            if ( Aig_ManRegNum(pTemp) == 0 )
            {
                pTemp->pSeqModel = NULL;
                RetValue = Fra_FraigSat( pTemp, pPars->nBTLimit, 0, 0, 0, 0, 0, 0, 0, 0 ); 
                if ( pTemp->pData )
                    pTemp->pSeqModel = Abc_CexCreate( Aig_ManRegNum(pMan), Saig_ManPiNum(pMan), (int *)pTemp->pData, 0, i, 1 );
//                pNtk->pModel = pTemp->pData, pTemp->pData = NULL;
            }
            else
                RetValue = Inter_ManPerformInterpolation( pTemp, pPars, &iFrame );
            if ( pTemp->pSeqModel )
            {
                if ( pPars->fDropSatOuts )
                {
                    Abc_Print( 1, "Output %d proved SAT in frame %d (replacing by const 0 and continuing...)\n", i, pTemp->pSeqModel->iFrame );
                    Aig_ObjPatchFanin0( pMan, pObjPo, Aig_ManConst0(pMan) );
                    Aig_ManStop( pTemp );
                    nTotalProvedSat++;
                    continue;
                }
                else
                {
                    Abc_Cex_t * pCex;
                    pCex = pMan->pSeqModel = pTemp->pSeqModel; pTemp->pSeqModel = NULL;
                    pCex->iPo = i;
                    Aig_ManStop( pTemp );
                    break;
                }
            }
            // if solved, remove the output
            if ( RetValue == 1 )
            {
                Aig_ObjPatchFanin0( pMan, pObjPo, Aig_ManConst0(pMan) );
//                    Abc_Print( 1, "Output %3d : Solved ", i );
            }
            else
            {
                Counter++;
//                    Abc_Print( 1, "Output %3d : Undec  ", i );
            }
//                Aig_ManPrintStats( pTemp );
            Aig_ManStop( pTemp );
            Abc_Print( 1, "Solving output %3d (out of %3d) using interpolation.\r", i, Saig_ManPoNum(pMan) );
        }
        Aig_ManCleanup( pMan );
        if ( pMan->pSeqModel == NULL )
        {
            Abc_Print( 1, "Interpolation left %d (out of %d) outputs unsolved              \n", Counter, Saig_ManPoNum(pMan) );
            if ( Counter )
                RetValue = -1;
        }
        if ( ppNtkRes )
        {
            pTemp = Aig_ManDupUnsolvedOutputs( pMan, 1 );
            *ppNtkRes = Aig_ManScl( pTemp, 1, 1, 0, -1, -1, 0, 0 );
            Aig_ManStop( pTemp );
        }
    }
    else
    {    
        RetValue = Inter_ManPerformInterpolation( pMan, pPars, &iFrame );
    }
    if ( nTotalProvedSat )
        Abc_Print( 1, "The total of %d outputs proved SAT and replaced by const 0 in this run.\n", nTotalProvedSat );
    if ( RetValue == 1 )
        Abc_Print( 1, "Property proved.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pMan->pSeqModel ? pMan->pSeqModel->iPo : -1, pMan->pName, iFrame );
    else if ( RetValue == -1 )
        Abc_Print( 1, "Property UNDECIDED.  " );
    else
        assert( 0 );
ABC_PRT( "Time", Abc_Clock() - clk );
    return RetValue;
}